

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O3

ECDSA_SIG * ECDSA_SIG_new(void)

{
  ECDSA_SIG *sig;
  BIGNUM *pBVar1;
  
  sig = (ECDSA_SIG *)OPENSSL_malloc(0x10);
  if (sig != (ECDSA_SIG *)0x0) {
    pBVar1 = BN_new();
    sig->r = pBVar1;
    pBVar1 = BN_new();
    sig->s = pBVar1;
    if (pBVar1 != (BIGNUM *)0x0 && sig->r != (BIGNUM *)0x0) {
      return sig;
    }
    ECDSA_SIG_free(sig);
  }
  return (ECDSA_SIG *)0x0;
}

Assistant:

ECDSA_SIG *ECDSA_SIG_new(void) {
  ECDSA_SIG *sig =
      reinterpret_cast<ECDSA_SIG *>(OPENSSL_malloc(sizeof(ECDSA_SIG)));
  if (sig == NULL) {
    return NULL;
  }
  sig->r = BN_new();
  sig->s = BN_new();
  if (sig->r == NULL || sig->s == NULL) {
    ECDSA_SIG_free(sig);
    return NULL;
  }
  return sig;
}